

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O2

SimpleString __thiscall MockNamedValue::toString(MockNamedValue *this)

{
  SimpleString *left;
  long *plVar1;
  bool bVar2;
  char *pcVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  long in_RSI;
  SimpleString SVar5;
  SimpleString SStack_68;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  size_t sVar4;
  
  left = (SimpleString *)(in_RSI + 0x18);
  SimpleString::SimpleString(&SStack_68,"bool");
  bVar2 = operator==(left,&SStack_68);
  SimpleString::~SimpleString(&SStack_68);
  if (bVar2) {
    SVar5 = ::StringFrom(SUB81(this,0));
    sVar4 = SVar5.bufferSize_;
    goto LAB_0012871a;
  }
  SimpleString::SimpleString(&SStack_68,"int");
  bVar2 = operator==(left,&SStack_68);
  SimpleString::~SimpleString(&SStack_68);
  if (bVar2) {
    ::StringFrom((int)&local_38);
    SimpleString::SimpleString(&local_48," ");
    SimpleString::operator+(&SStack_68,&local_38);
    BracketsFormattedHexStringFrom((int)&local_58);
    SimpleString::operator+((SimpleString *)this,&SStack_68);
  }
  else {
    SimpleString::SimpleString(&SStack_68,"unsigned int");
    bVar2 = operator==(left,&SStack_68);
    SimpleString::~SimpleString(&SStack_68);
    if (bVar2) {
      ::StringFrom((uint)&local_38);
      SimpleString::SimpleString(&local_48," ");
      SimpleString::operator+(&SStack_68,&local_38);
      BracketsFormattedHexStringFrom((uint)&local_58);
      SimpleString::operator+((SimpleString *)this,&SStack_68);
    }
    else {
      SimpleString::SimpleString(&SStack_68,"long int");
      bVar2 = operator==(left,&SStack_68);
      SimpleString::~SimpleString(&SStack_68);
      if (bVar2) {
        ::StringFrom((long)&local_38);
        SimpleString::SimpleString(&local_48," ");
        SimpleString::operator+(&SStack_68,&local_38);
        BracketsFormattedHexStringFrom((long)&local_58);
        SimpleString::operator+((SimpleString *)this,&SStack_68);
      }
      else {
        SimpleString::SimpleString(&SStack_68,"unsigned long int");
        bVar2 = operator==(left,&SStack_68);
        SimpleString::~SimpleString(&SStack_68);
        if (bVar2) {
          ::StringFrom((unsigned_long)&local_38);
          SimpleString::SimpleString(&local_48," ");
          SimpleString::operator+(&SStack_68,&local_38);
          BracketsFormattedHexStringFrom((unsigned_long)&local_58);
          SimpleString::operator+((SimpleString *)this,&SStack_68);
        }
        else {
          SimpleString::SimpleString(&SStack_68,"long long int");
          bVar2 = operator==(left,&SStack_68);
          SimpleString::~SimpleString(&SStack_68);
          if (bVar2) {
            ::StringFrom((cpputest_longlong)&local_38);
            SimpleString::SimpleString(&local_48," ");
            SimpleString::operator+(&SStack_68,&local_38);
            BracketsFormattedHexStringFrom((cpputest_longlong)&local_58);
            SimpleString::operator+((SimpleString *)this,&SStack_68);
          }
          else {
            SimpleString::SimpleString(&SStack_68,"unsigned long long int");
            bVar2 = operator==(left,&SStack_68);
            SimpleString::~SimpleString(&SStack_68);
            if (!bVar2) {
              SimpleString::SimpleString(&SStack_68,"const char*");
              bVar2 = operator==(left,&SStack_68);
              SimpleString::~SimpleString(&SStack_68);
              if (bVar2) {
                SimpleString::SimpleString((SimpleString *)this,*(char **)(in_RSI + 0x28));
                sVar4 = extraout_RDX_00;
                goto LAB_0012871a;
              }
              SimpleString::SimpleString(&SStack_68,"void*");
              bVar2 = operator==(left,&SStack_68);
              SimpleString::~SimpleString(&SStack_68);
              if (!bVar2) {
                SimpleString::SimpleString(&SStack_68,"void (*)()");
                bVar2 = operator==(left,&SStack_68);
                SimpleString::~SimpleString(&SStack_68);
                if (bVar2) {
                  SVar5 = ::StringFrom((_func_void *)this);
                  sVar4 = SVar5.bufferSize_;
                  goto LAB_0012871a;
                }
                SimpleString::SimpleString(&SStack_68,"const void*");
                bVar2 = operator==(left,&SStack_68);
                SimpleString::~SimpleString(&SStack_68);
                if (!bVar2) {
                  SimpleString::SimpleString(&SStack_68,"double");
                  bVar2 = operator==(left,&SStack_68);
                  SimpleString::~SimpleString(&SStack_68);
                  if (bVar2) {
                    SVar5 = ::StringFrom(*(double *)(in_RSI + 0x28),(int)this);
                    sVar4 = SVar5.bufferSize_;
                  }
                  else {
                    SimpleString::SimpleString(&SStack_68,"const unsigned char*");
                    bVar2 = operator==(left,&SStack_68);
                    SimpleString::~SimpleString(&SStack_68);
                    if (bVar2) {
                      SVar5 = StringFromBinaryWithSizeOrNull
                                        ((uchar *)this,*(size_t *)(in_RSI + 0x28));
                      sVar4 = SVar5.bufferSize_;
                    }
                    else {
                      plVar1 = *(long **)(in_RSI + 0x40);
                      if (plVar1 == (long *)0x0) {
                        pcVar3 = SimpleString::asCharString(left);
                        SVar5 = StringFromFormat((char *)this,"No comparator found for type: \"%s\""
                                                 ,pcVar3);
                        sVar4 = SVar5.bufferSize_;
                      }
                      else {
                        (**(code **)(*plVar1 + 0x18))(this,plVar1,*(undefined8 *)(in_RSI + 0x28));
                        sVar4 = extraout_RDX_01;
                      }
                    }
                  }
                  goto LAB_0012871a;
                }
              }
              SVar5 = ::StringFrom(this);
              sVar4 = SVar5.bufferSize_;
              goto LAB_0012871a;
            }
            ::StringFrom((cpputest_ulonglong)&local_38);
            SimpleString::SimpleString(&local_48," ");
            SimpleString::operator+(&SStack_68,&local_38);
            BracketsFormattedHexStringFrom((cpputest_ulonglong)&local_58);
            SimpleString::operator+((SimpleString *)this,&SStack_68);
          }
        }
      }
    }
  }
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&SStack_68);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  sVar4 = extraout_RDX;
LAB_0012871a:
  SVar5.bufferSize_ = sVar4;
  SVar5.buffer_ = (char *)this;
  return SVar5;
}

Assistant:

SimpleString MockNamedValue::toString() const
{
    if (type_ == "bool")
        return StringFrom(value_.boolValue_);
    else if (type_ == "int")
        return StringFrom(value_.intValue_) + " " + BracketsFormattedHexStringFrom(value_.intValue_);
    else if (type_ == "unsigned int")
        return StringFrom(value_.unsignedIntValue_) + " " + BracketsFormattedHexStringFrom(value_.unsignedIntValue_);
    else if (type_ == "long int")
        return StringFrom(value_.longIntValue_) + " " + BracketsFormattedHexStringFrom(value_.longIntValue_);
    else if (type_ == "unsigned long int")
        return StringFrom(value_.unsignedLongIntValue_) + " " + BracketsFormattedHexStringFrom(value_.unsignedLongIntValue_);
#if CPPUTEST_USE_LONG_LONG
    else if (type_ == "long long int")
        return StringFrom(value_.longLongIntValue_) + " " + BracketsFormattedHexStringFrom(value_.longLongIntValue_);
    else if (type_ == "unsigned long long int")
        return StringFrom(value_.unsignedLongLongIntValue_) + " " + BracketsFormattedHexStringFrom(value_.unsignedLongLongIntValue_);
#endif
    else if (type_ == "const char*")
        return value_.stringValue_;
    else if (type_ == "void*")
        return StringFrom(value_.pointerValue_);
    else if (type_ == "void (*)()")
        return StringFrom(value_.functionPointerValue_);
    else if (type_ == "const void*")
        return StringFrom(value_.constPointerValue_);
    else if (type_ == "double")
        return StringFrom(value_.doubleValue_.value);
    else if (type_ == "const unsigned char*")
        return StringFromBinaryWithSizeOrNull(value_.memoryBufferValue_, size_);

    if (comparator_)
        return comparator_->valueToString(value_.constObjectPointerValue_);

    return StringFromFormat("No comparator found for type: \"%s\"", type_.asCharString());

}